

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_localtime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  jx9_value *pObj;
  tm *ptVar10;
  jx9_value *pjVar11;
  jx9_value *pArray;
  jx9_context *pjVar12;
  bool bVar13;
  time_t t;
  anon_union_8_3_18420de5_for_x local_48;
  int local_3c;
  jx9_context *local_38;
  
  if (nArg < 1) {
    time(&local_48.iVal);
  }
  else {
    pjVar11 = *apArg;
    if ((pjVar11->iFlags & 2) != 0) {
      jx9MemObjToInteger(pjVar11);
      local_48 = pjVar11->x;
      ptVar10 = localtime(&local_48.iVal);
      if (ptVar10 != (tm *)0x0) goto LAB_001354dc;
    }
    time(&local_48.iVal);
  }
LAB_001354dc:
  ptVar10 = localtime(&local_48.iVal);
  iVar1 = ptVar10->tm_hour;
  iVar2 = ptVar10->tm_sec;
  iVar3 = ptVar10->tm_min;
  iVar4 = ptVar10->tm_mon;
  iVar5 = ptVar10->tm_mday;
  iVar6 = ptVar10->tm_year;
  iVar7 = ptVar10->tm_yday;
  iVar8 = ptVar10->tm_wday;
  iVar9 = ptVar10->tm_isdst;
  pjVar11 = jx9_context_new_scalar(pCtx);
  if ((pjVar11 == (jx9_value *)0x0) ||
     (local_3c = iVar9, pArray = jx9_context_new_array(pCtx), pArray == (jx9_value *)0x0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    bVar13 = true;
    local_38 = pCtx;
    if (1 < nArg) {
      pObj = apArg[1];
      jx9MemObjToBool(pObj);
      bVar13 = *(int *)&pObj->x == 0;
    }
    jx9MemObjRelease(pjVar11);
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar2;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_sec",pjVar11);
    }
    jx9MemObjRelease(pjVar11);
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar3;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_min",pjVar11);
    }
    jx9MemObjRelease(pjVar11);
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar1;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_hour",pjVar11);
    }
    jx9MemObjRelease(pjVar11);
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar5;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_mday",pjVar11);
    }
    jx9MemObjRelease(pjVar11);
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar4;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_mon",pjVar11);
    }
    jx9MemObjRelease(pjVar11);
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar6;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_year",pjVar11);
    }
    jx9MemObjRelease(pjVar11);
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar8;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_wday",pjVar11);
    }
    jx9MemObjRelease(pjVar11);
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)iVar7;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_yday",pjVar11);
    }
    jx9MemObjRelease(pjVar11);
    pjVar12 = local_38;
    pjVar11->x = (anon_union_8_3_18420de5_for_x)(long)local_3c;
    pjVar11->iFlags = pjVar11->iFlags & 0xfffffe90U | 2;
    if (bVar13) {
      if ((pArray->iFlags & 0x40) != 0) {
        HashmapInsert((jx9_hashmap *)(pArray->x).pOther,(jx9_value *)0x0,pjVar11);
      }
    }
    else {
      jx9_array_add_strkey_elem(pArray,"tm_isdst",pjVar11);
      pjVar12 = local_38;
    }
    jx9MemObjStore(pArray,pjVar12->pRet);
  }
  return 0;
}

Assistant:

static int jx9Builtin_localtime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pArray;
	int isAssoc = 0;
	Sytm sTm;
	if( nArg < 1 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS); /* TODO(chems): GMT not local */
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[0]) ){
			t = (time_t)jx9_value_to_int64(apArg[0]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Element value */
	pValue = jx9_context_new_scalar(pCtx);
	if( pValue == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		/* Return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg > 1 ){
		isAssoc = jx9_value_to_bool(apArg[1]); 
	}
	/* Fill the array */
	/* Seconds */
	jx9_value_int(pValue, sTm.tm_sec);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_sec", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Minutes */
	jx9_value_int(pValue, sTm.tm_min);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_min", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Hours */
	jx9_value_int(pValue, sTm.tm_hour);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_hour", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* mday */
	jx9_value_int(pValue, sTm.tm_mday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_mday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* mon */
	jx9_value_int(pValue, sTm.tm_mon);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_mon", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* year since 1900 */
	jx9_value_int(pValue, sTm.tm_year-1900);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_year", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* wday */
	jx9_value_int(pValue, sTm.tm_wday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_wday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* yday */
	jx9_value_int(pValue, sTm.tm_yday);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_yday", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* isdst */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&sTm.tm_isdst);
#endif
#endif
#endif
	jx9_value_int(pValue, sTm.tm_isdst);
	if( isAssoc ){
		jx9_array_add_strkey_elem(pArray, "tm_isdst", pValue);
	}else{
		jx9_array_add_elem(pArray, 0/* Automatic index */, pValue);
	}
	/* Return the array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}